

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O2

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_is_quad_uniform_control_flow(Impl *this,SPIRVModule *module)

{
  Builder *pBVar1;
  undefined1 auVar2 [16];
  _Head_base<0UL,_spv::Instruction_*,_false> _Var3;
  Id IVar4;
  Id IVar5;
  Block *entry;
  Id local_114;
  _Head_base<0UL,_spv::Instruction_*,_false> local_110;
  _Head_base<0UL,_spv::Instruction_*,_false> local_108;
  _Head_base<0UL,_spv::Instruction_*,_false> local_100;
  _Head_base<0UL,_spv::Instruction_*,_false> local_f8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_f0;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_e8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_c8;
  Id local_bc;
  uint local_b8;
  Id bool_type;
  Id uvec4_type;
  Id uint_type;
  _Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_a8;
  Builder *local_90;
  Function *local_88;
  Block *local_80;
  _Head_base<0UL,_spv::Instruction_*,_false> local_78;
  _Head_base<0UL,_spv::Instruction_*,_false> local_70;
  _Head_base<0UL,_spv::Instruction_*,_false> local_68;
  _Head_base<0UL,_spv::Instruction_*,_false> local_60;
  _Head_base<0UL,_spv::Instruction_*,_false> local_58;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  undefined4 local_34;
  
  IVar4 = this->is_quad_uniform_call_id;
  if (IVar4 == 0) {
    pBVar1 = &this->builder;
    local_80 = (this->builder).buildPoint;
    entry = (Block *)0x0;
    uint_type = spv::Builder::makeUintType(pBVar1,0x20);
    uvec4_type = spv::Builder::makeVectorType(pBVar1,uint_type,4);
    bool_type = spv::Builder::makeBoolType(pBVar1);
    local_a8._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
    local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88 = spv::Builder::makeFunctionEntry
                         (pBVar1,DecorationMax,bool_type,"IsQuadUniformControlFlow",
                          (Vector<Id> *)&local_a8,&local_e8,&entry);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector(&local_e8);
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              (&local_a8);
    IVar4 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar4;
    local_a8._M_impl.super__Vector_impl_data._M_start._0_4_ = IVar4;
    local_e8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_e8.
                           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x153);
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_c8,(uint *)&local_a8,&uvec4_type);
    _Var3._M_head_impl = local_c8._M_head_impl;
    IVar4 = spv::Builder::makeUintConstant(pBVar1,3,false);
    spv::Instruction::addIdOperand(_Var3._M_head_impl,IVar4);
    _Var3._M_head_impl = local_c8._M_head_impl;
    IVar4 = spv::Builder::makeBoolConstant(pBVar1,true,false);
    spv::Instruction::addIdOperand(_Var3._M_head_impl,IVar4);
    IVar5 = spv::Builder::makeUintConstant(pBVar1,2,false);
    local_114 = spv::Builder::makeUintConstant(pBVar1,1,false);
    IVar4 = uvec4_type;
    local_e8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(IVar5,IVar5);
    local_e8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(IVar5,IVar5);
    local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_a8,
               &local_e8,
               &local_e8.
                super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_bc = spv::Builder::makeCompositeConstant(pBVar1,IVar4,(Vector<Id> *)&local_a8,false);
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              (&local_a8);
    IVar4 = uvec4_type;
    local_e8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = local_114;
    local_e8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ = local_114;
    local_e8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(local_114,local_114);
    local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90 = pBVar1;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_a8,
               &local_e8,
               &local_e8.
                super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_114 = spv::Builder::makeCompositeConstant(pBVar1,IVar4,(Vector<Id> *)&local_a8,false);
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              (&local_a8);
    IVar4 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar4;
    local_e8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_e8.
                           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar4);
    local_f0._M_head_impl._0_4_ = 0xc2;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_a8,(uint *)&local_e8,&uvec4_type);
    spv::Instruction::addIdOperand
              ((Instruction *)local_a8._M_impl.super__Vector_impl_data._M_start,
               (local_c8._M_head_impl)->resultId);
    spv::Instruction::addIdOperand
              ((Instruction *)local_a8._M_impl.super__Vector_impl_data._M_start,local_bc);
    local_f0._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_f0._M_head_impl;
    local_110._M_head_impl._0_4_ = 0xc5;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_e8,(uint *)&local_f0,&uvec4_type);
    spv::Instruction::addIdOperand
              ((Instruction *)
               local_e8.
               super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,(local_c8._M_head_impl)->resultId);
    spv::Instruction::addIdOperand
              ((Instruction *)
               local_e8.
               super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_a8._M_impl.super__Vector_impl_data._M_start[2]);
    local_110._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_110._M_head_impl;
    local_f8._M_head_impl._0_4_ = 0xc2;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_f0,(uint *)&local_110,&uvec4_type);
    spv::Instruction::addIdOperand
              (local_f0._M_head_impl,
               *(Id *)((long)local_e8.
                             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 8));
    spv::Instruction::addIdOperand(local_f0._M_head_impl,local_114);
    local_f8._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_f8._M_head_impl;
    local_100._M_head_impl._0_4_ = 0xc5;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_110,(uint *)&local_f8,&uvec4_type);
    spv::Instruction::addIdOperand
              (local_110._M_head_impl,
               *(Id *)((long)local_e8.
                             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 8));
    spv::Instruction::addIdOperand(local_110._M_head_impl,(local_f0._M_head_impl)->resultId);
    local_100._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_100._M_head_impl;
    local_108._M_head_impl._0_4_ = 0x3d;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_f8,(uint *)&local_100,&uint_type);
    _Var3._M_head_impl = local_f8._M_head_impl;
    IVar4 = get_builtin_shader_input(this,BuiltInSubgroupLocalInvocationId);
    spv::Instruction::addIdOperand(_Var3._M_head_impl,IVar4);
    local_108._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_108._M_head_impl;
    local_b8 = 199;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_100,(uint *)&local_108,&uint_type);
    spv::Instruction::addIdOperand(local_100._M_head_impl,(local_f8._M_head_impl)->resultId);
    pBVar1 = local_90;
    _Var3._M_head_impl = local_100._M_head_impl;
    IVar4 = spv::Builder::makeUintConstant(local_90,0xfffffffc,false);
    spv::Instruction::addIdOperand(_Var3._M_head_impl,IVar4);
    local_b8 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = local_b8;
    local_34 = 0x155;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_108,&local_b8,&bool_type);
    _Var3._M_head_impl = local_108._M_head_impl;
    IVar4 = spv::Builder::makeUintConstant(pBVar1,3,false);
    spv::Instruction::addIdOperand(_Var3._M_head_impl,IVar4);
    spv::Instruction::addIdOperand(local_108._M_head_impl,(local_110._M_head_impl)->resultId);
    spv::Instruction::addIdOperand(local_108._M_head_impl,(local_100._M_head_impl)->resultId);
    IVar4 = (local_108._M_head_impl)->resultId;
    local_40._M_head_impl = local_c8._M_head_impl;
    local_c8._M_head_impl = (Instruction *)0x0;
    spv::Block::addInstruction
              (entry,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                     &local_40);
    if (local_40._M_head_impl != (Instruction *)0x0) {
      (*(local_40._M_head_impl)->_vptr_Instruction[1])();
    }
    local_40._M_head_impl = (Instruction *)0x0;
    local_48._M_head_impl = (Instruction *)local_a8._M_impl.super__Vector_impl_data._M_start;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_a8._M_impl.super__Vector_impl_data._M_finish;
    local_a8._M_impl.super__Vector_impl_data._0_16_ = auVar2 << 0x40;
    spv::Block::addInstruction
              (entry,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                     &local_48);
    if (local_48._M_head_impl != (Instruction *)0x0) {
      (*(local_48._M_head_impl)->_vptr_Instruction[1])();
    }
    local_48._M_head_impl = (Instruction *)0x0;
    local_50._M_head_impl =
         (Instruction *)
         local_e8.
         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_e8.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spv::Block::addInstruction
              (entry,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                     &local_50);
    if (local_50._M_head_impl != (Instruction *)0x0) {
      (*(local_50._M_head_impl)->_vptr_Instruction[1])();
    }
    local_50._M_head_impl = (Instruction *)0x0;
    local_58._M_head_impl = local_f0._M_head_impl;
    local_f0._M_head_impl = (Instruction *)0x0;
    spv::Block::addInstruction
              (entry,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                     &local_58);
    if (local_58._M_head_impl != (Instruction *)0x0) {
      (*(local_58._M_head_impl)->_vptr_Instruction[1])();
    }
    local_58._M_head_impl = (Instruction *)0x0;
    local_60._M_head_impl = local_110._M_head_impl;
    local_110._M_head_impl = (Instruction *)0x0;
    spv::Block::addInstruction
              (entry,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                     &local_60);
    if (local_60._M_head_impl != (Instruction *)0x0) {
      (*(local_60._M_head_impl)->_vptr_Instruction[1])();
    }
    local_60._M_head_impl = (Instruction *)0x0;
    local_68._M_head_impl = local_f8._M_head_impl;
    local_f8._M_head_impl = (Instruction *)0x0;
    spv::Block::addInstruction
              (entry,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                     &local_68);
    if (local_68._M_head_impl != (Instruction *)0x0) {
      (*(local_68._M_head_impl)->_vptr_Instruction[1])();
    }
    local_68._M_head_impl = (Instruction *)0x0;
    local_70._M_head_impl = local_100._M_head_impl;
    local_100._M_head_impl = (Instruction *)0x0;
    spv::Block::addInstruction
              (entry,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                     &local_70);
    if (local_70._M_head_impl != (Instruction *)0x0) {
      (*(local_70._M_head_impl)->_vptr_Instruction[1])();
    }
    local_70._M_head_impl = (Instruction *)0x0;
    local_78._M_head_impl = local_108._M_head_impl;
    local_108._M_head_impl = (Instruction *)0x0;
    spv::Block::addInstruction
              (entry,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                     &local_78);
    if (local_78._M_head_impl != (Instruction *)0x0) {
      (*(local_78._M_head_impl)->_vptr_Instruction[1])();
    }
    local_78._M_head_impl = (Instruction *)0x0;
    spv::Builder::makeReturn(pBVar1,false,IVar4);
    (this->builder).buildPoint = local_80;
    spv::Builder::addCapability(pBVar1,CapabilityGroupNonUniformBallot);
    spv::Builder::addCapability(pBVar1,CapabilityGroupNonUniform);
    IVar4 = (local_88->functionInstruction).resultId;
    this->is_quad_uniform_call_id = IVar4;
    if (local_108._M_head_impl != (Instruction *)0x0) {
      (*(local_108._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_100._M_head_impl != (Instruction *)0x0) {
      (*(local_100._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_f8._M_head_impl != (Instruction *)0x0) {
      (*(local_f8._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_110._M_head_impl != (Instruction *)0x0) {
      (*(local_110._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_f0._M_head_impl != (Instruction *)0x0) {
      (*(local_f0._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_e8.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_e8.
                            super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
    if (local_a8._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)local_a8._M_impl.super__Vector_impl_data._M_start + 8))();
    }
    if (local_c8._M_head_impl != (Instruction *)0x0) {
      (*(local_c8._M_head_impl)->_vptr_Instruction[1])();
    }
  }
  return IVar4;
}

Assistant:

spv::Id SPIRVModule::Impl::build_is_quad_uniform_control_flow(SPIRVModule &module)
{
	if (is_quad_uniform_call_id)
		return is_quad_uniform_call_id;

	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id uvec4_type = builder.makeVectorType(uint_type, 4);
	spv::Id bool_type = builder.makeBoolType();

	auto *func = builder.makeFunctionEntry(spv::NoPrecision, bool_type,
	                                       "IsQuadUniformControlFlow",
	                                       {}, {}, &entry);

	auto ballot_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpGroupNonUniformBallot);
	ballot_op->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
	ballot_op->addIdOperand(builder.makeBoolConstant(true));

	spv::Id uint_2 = builder.makeUintConstant(2);
	spv::Id uint_1 = builder.makeUintConstant(1);
	uint_2 = builder.makeCompositeConstant(uvec4_type, { uint_2, uint_2, uint_2, uint_2 });
	uint_1 = builder.makeCompositeConstant(uvec4_type, { uint_1, uint_1, uint_1, uint_1 });

	auto shift_2 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpShiftRightLogical);
	shift_2->addIdOperand(ballot_op->getResultId());
	shift_2->addIdOperand(uint_2);
	auto or_2 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpBitwiseOr);
	or_2->addIdOperand(ballot_op->getResultId());
	or_2->addIdOperand(shift_2->getResultId());
	auto shift_1 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpShiftRightLogical);
	shift_1->addIdOperand(or_2->getResultId());
	shift_1->addIdOperand(uint_1);
	auto or_1 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpBitwiseOr);
	or_1->addIdOperand(or_2->getResultId());
	or_1->addIdOperand(shift_1->getResultId());

	auto load_invocation_id = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpLoad);
	load_invocation_id->addIdOperand(get_builtin_shader_input(spv::BuiltInSubgroupLocalInvocationId));

	auto and_invocation_id = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpBitwiseAnd);
	and_invocation_id->addIdOperand(load_invocation_id->getResultId());
	and_invocation_id->addIdOperand(builder.makeUintConstant(~3u));

	auto extract_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpGroupNonUniformBallotBitExtract);
	extract_op->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
	extract_op->addIdOperand(or_1->getResultId());
	extract_op->addIdOperand(and_invocation_id->getResultId());
	spv::Id result_id = extract_op->getResultId();

	entry->addInstruction(std::move(ballot_op));
	entry->addInstruction(std::move(shift_2));
	entry->addInstruction(std::move(or_2));
	entry->addInstruction(std::move(shift_1));
	entry->addInstruction(std::move(or_1));
	entry->addInstruction(std::move(load_invocation_id));
	entry->addInstruction(std::move(and_invocation_id));
	entry->addInstruction(std::move(extract_op));

	builder.makeReturn(false, result_id);
	builder.setBuildPoint(current_build_point);
	builder.addCapability(spv::CapabilityGroupNonUniformBallot);
	builder.addCapability(spv::CapabilityGroupNonUniform);

	is_quad_uniform_call_id = func->getId();
	return is_quad_uniform_call_id;
}